

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O0

int __thiscall foxxll::ufs_file_base::unlink(ufs_file_base *this,char *__name)

{
  int extraout_EAX;
  int iVar1;
  Logger *pLVar2;
  char *pcVar3;
  ostream *poVar4;
  int *piVar5;
  io_error *this_00;
  string local_338;
  ostringstream local_318 [8];
  ostringstream msg;
  Logger local_190;
  LoggerVoidify local_11;
  ufs_file_base *local_10;
  ufs_file_base *this_local;
  
  local_10 = this;
  if ((this->is_device_ & 1U) == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = ::unlink(pcVar3);
    if (iVar1 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_318);
      poVar4 = std::operator<<((ostream *)local_318,"Error in ");
      poVar4 = std::operator<<(poVar4,"void foxxll::ufs_file_base::unlink()");
      poVar4 = std::operator<<(poVar4," : ");
      poVar4 = std::operator<<(poVar4,"unlink() path=");
      poVar4 = std::operator<<(poVar4,(string *)&this->filename_);
      poVar4 = std::operator<<(poVar4," fd=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->file_des_);
      poVar4 = std::operator<<(poVar4," : ");
      piVar5 = __errno_location();
      pcVar3 = strerror(*piVar5);
      std::operator<<(poVar4,pcVar3);
      this_00 = (io_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::ostringstream::str();
      io_error::io_error(this_00,&local_338);
      __cxa_throw(this_00,&io_error::typeinfo,io_error::~io_error);
    }
  }
  else {
    tlx::Logger::Logger(&local_190);
    pLVar2 = tlx::Logger::operator<<(&local_190,(char (*) [15])"unlink() path=");
    pLVar2 = tlx::Logger::operator<<(pLVar2,&this->filename_);
    pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [32])" skipped as file is device node");
    tlx::LoggerVoidify::operator&(&local_11,pLVar2);
    tlx::Logger::~Logger(&local_190);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void ufs_file_base::unlink()
{
    if (is_device_) {
        TLX_LOG1 << "unlink() path=" << filename_
                 << " skipped as file is device node";
        return;
    }

    if (::unlink(filename_.c_str()) != 0)
        FOXXLL_THROW_ERRNO(io_error, "unlink() path=" << filename_ << " fd=" << file_des_);
}